

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.hpp
# Opt level: O3

void __thiscall
Apple::II::Video::
Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler,_false>
::advance(Video<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::VideoBusHandler,_false>
          *this,Cycles cycles)

{
  uint uVar1;
  CRT *this_00;
  VideoBusHandler *pVVar2;
  ScanTarget *pSVar3;
  uint8_t *puVar4;
  ulong uVar5;
  int iVar6;
  GraphicsMode GVar7;
  int iVar8;
  undefined4 extraout_var;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  WrappedInt<Cycles> local_50;
  
  if ((int)cycles.super_WrappedInt<Cycles>.length_ != 0) {
    this_00 = &(this->super_VideoBase).crt_;
    local_50 = cycles.super_WrappedInt<Cycles>.length_;
    do {
      iVar8 = (this->super_VideoBase).column_;
      iVar11 = (int)local_50.length_;
      iVar13 = 0x41 - iVar8;
      if (iVar11 < 0x41 - iVar8) {
        iVar13 = iVar11;
      }
      iVar14 = (this->super_VideoBase).row_;
      iVar12 = iVar13 + iVar8;
      uVar1 = iVar14 - 0xdc;
      if (uVar1 < 3) {
        iVar14 = 0x2d;
        if (0x2d < iVar8) {
          iVar14 = iVar8;
        }
        iVar16 = 0x31;
        if (iVar12 < 0x31) {
          iVar16 = iVar12;
        }
        iVar6 = iVar13;
        if (iVar16 - iVar14 != 0 && iVar14 <= iVar16) {
          if (iVar8 < 0x2d) {
            Outputs::CRT::CRT::output_sync(this_00,(iVar14 - iVar8) * 0xe);
          }
          Outputs::CRT::CRT::output_blank(this_00,(iVar16 - iVar14) * 0xe);
          if (iVar12 < 0x32) goto LAB_00282afc;
          iVar6 = iVar12 - iVar16;
        }
        Outputs::CRT::CRT::output_sync(this_00,iVar6 * 0xe);
      }
      else {
        GVar7 = VideoSwitches<Cycles>::graphics_mode((VideoSwitches<Cycles> *)this,iVar14);
        uVar18 = (this->super_VideoBase).row_;
        iVar8 = (this->super_VideoBase).column_;
        if (iVar8 < 0x28 && (int)uVar18 < 0xc0) {
          uVar17 = (uVar18 & 0x38) * 0x10 + (uVar18 >> 6) * 0x28;
          iVar14 = 0x28;
          if (iVar12 < 0x28) {
            iVar14 = iVar12;
          }
          bVar10 = (this->super_VideoBase).super_VideoSwitches<Cycles>.internal_.store_80;
          uVar15 = (uint)(this->super_VideoBase).super_VideoSwitches<Cycles>.internal_.page2;
          if ((GVar7 & ~DoubleText) == HighRes) {
            iVar16 = uVar15 * 0x2000 + 0x2000;
            if (bVar10 != false) {
              iVar16 = 0x2000;
            }
            iVar16 = iVar16 + (uVar18 & 7) * 0x400 + (uVar17 & 0xfff8);
          }
          else {
            iVar16 = uVar15 * 0x400 + 0x400;
            if (bVar10 != false) {
              iVar16 = 0x400;
            }
            iVar16 = iVar16 + uVar17;
          }
          pVVar2 = this->bus_handler_;
          uVar18 = iVar16 + iVar8 & 0xffff;
          memcpy((this->super_VideoBase).base_stream_._M_elems + iVar8,pVVar2->ram_ + uVar18,
                 (long)(iVar14 - iVar8));
          memcpy((this->super_VideoBase).auxiliary_stream_._M_elems + iVar8,
                 pVVar2->aux_ram_ + uVar18,(long)(iVar14 - iVar8));
          uVar18 = (this->super_VideoBase).row_;
        }
        uVar17 = (this->super_VideoBase).column_;
        if ((int)uVar18 < 0xc0) {
          if (uVar17 == 0) {
            pSVar3 = (this->super_VideoBase).crt_.scan_target_;
            iVar8 = (*pSVar3->_vptr_ScanTarget[5])(pSVar3,0x238,1);
            (this->super_VideoBase).crt_.allocated_data_length_ =
                 -(ulong)((uint8_t *)CONCAT44(extraout_var,iVar8) == (uint8_t *)0x0) | 0x238;
            (this->super_VideoBase).pixel_pointer_ = (uint8_t *)CONCAT44(extraout_var,iVar8);
            (this->super_VideoBase).graphics_carry_ = '\0';
            (this->super_VideoBase).was_double_ = true;
            uVar17 = (this->super_VideoBase).column_;
          }
          if (0x27 < (int)uVar17) goto LAB_00282a3c;
          uVar9 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar9 = 0;
          }
          iVar8 = 0x28;
          if (iVar12 < 0x28) {
            iVar8 = iVar12;
          }
          uVar18 = (this->super_VideoBase).row_;
          bVar10 = (bool)((byte)GVar7 & 1);
          iVar14 = (int)uVar9;
          if (((GVar7 & DoubleText) == Text) && ((this->super_VideoBase).was_double_ == true)) {
            puVar4 = (this->super_VideoBase).pixel_pointer_;
            if (puVar4 != (uint8_t *)0x0) {
              uVar5 = uVar9 * 0xe;
              puVar4[uVar5 + 6] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar5 + 5] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar5 + 4] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar5 + 3] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar5 + 2] = '\0';
              (this->super_VideoBase).pixel_pointer_[(uVar5 & 0xffffffff) + 1] = '\0';
              (this->super_VideoBase).pixel_pointer_[uVar5] = '\0';
              goto LAB_002827d7;
            }
            (this->super_VideoBase).was_double_ = bVar10;
          }
          else {
LAB_002827d7:
            puVar4 = (this->super_VideoBase).pixel_pointer_;
            (this->super_VideoBase).was_double_ = bVar10;
            if ((puVar4 != (uint8_t *)0x0) && (GVar7 < (FatLowRes|DoubleText))) {
              uVar18 = uVar18 & 7;
              switch(GVar7) {
              case Text:
                VideoBase::output_text
                          (&this->super_VideoBase,puVar4 + (ulong)(uint)(iVar14 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14),(ulong)uVar18);
                break;
              case DoubleText:
                VideoBase::output_double_text
                          (&this->super_VideoBase,puVar4 + (uint)(iVar14 * 0xe),
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (this->super_VideoBase).auxiliary_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14),(ulong)uVar18);
                break;
              case HighRes:
                VideoBase::output_high_resolution
                          (&this->super_VideoBase,puVar4 + (ulong)(uint)(iVar14 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14));
                break;
              case DoubleHighRes:
                VideoBase::output_double_high_resolution
                          (&this->super_VideoBase,puVar4 + (uint)(iVar14 * 0xe),
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (this->super_VideoBase).auxiliary_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14));
                break;
              case LowRes:
                VideoBase::output_low_resolution
                          (&this->super_VideoBase,puVar4 + (ulong)(uint)(iVar14 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14),iVar14,uVar18);
                break;
              case DoubleLowRes:
                VideoBase::output_double_low_resolution
                          (&this->super_VideoBase,puVar4 + (uint)(iVar14 * 0xe),
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (this->super_VideoBase).auxiliary_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14),iVar14,uVar18);
                break;
              case FatLowRes:
                VideoBase::output_fat_low_resolution
                          (&this->super_VideoBase,puVar4 + (ulong)(uint)(iVar14 * 0xe) + 7,
                           (this->super_VideoBase).base_stream_._M_elems + uVar9,
                           (long)(iVar8 - iVar14),iVar14,uVar18);
              }
            }
          }
          if (0x27 < iVar12) {
            puVar4 = (this->super_VideoBase).pixel_pointer_;
            if (puVar4 != (uint8_t *)0x0) {
              if ((this->super_VideoBase).was_double_ == true) {
                puVar4[0x237] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x236] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x235] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x234] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x233] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x232] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x231] = '\0';
                (this->super_VideoBase).pixel_pointer_[0x230] = '\0';
              }
              else if ((GVar7 == HighRes) &&
                      ((char)(this->super_VideoBase).base_stream_._M_elems[0x27] < '\0')) {
                puVar4[0x237] = (this->super_VideoBase).graphics_carry_;
              }
              else {
                puVar4[0x237] = '\0';
              }
            }
            Outputs::CRT::CRT::output_data(this_00,0x238,0x238);
            (this->super_VideoBase).pixel_pointer_ = (uint8_t *)0x0;
            goto LAB_00282a3c;
          }
        }
        else {
          if (((int)uVar17 < 0x28) && (0x27 < iVar12)) {
            Outputs::CRT::CRT::output_blank(this_00,0x238);
          }
LAB_00282a3c:
          iVar8 = (this->super_VideoBase).column_;
          if ((iVar8 < 0x31) && (0x30 < iVar12)) {
            Outputs::CRT::CRT::output_blank(this_00,0x76);
            iVar8 = (this->super_VideoBase).column_;
          }
          if ((iVar8 < 0x35) && (0x34 < iVar12)) {
            Outputs::CRT::CRT::output_sync(this_00,0x38);
          }
        }
        iVar8 = (this->super_VideoBase).column_;
        if ((this->super_VideoBase).super_VideoSwitches<Cycles>.internal_.text == false) {
          iVar14 = 0x36;
          if (0x36 < iVar8) {
            iVar14 = iVar8;
          }
          iVar16 = 0x39;
          if (iVar12 < 0x39) {
            iVar16 = iVar12;
          }
          if (iVar16 - iVar14 != 0 && iVar14 <= iVar16) {
            Outputs::CRT::CRT::output_colour_burst(this_00,(iVar16 - iVar14) * 0xe,0xc0,false,')');
            iVar8 = (this->super_VideoBase).column_;
          }
          bVar10 = SBORROW4(iVar8,0x39);
          iVar14 = iVar8 + -0x39;
          iVar16 = 0x38;
        }
        else {
          bVar10 = SBORROW4(iVar8,0x36);
          iVar14 = iVar8 + -0x36;
          iVar16 = 0x35;
        }
        if (bVar10 != iVar14 < 0) {
          iVar8 = iVar16;
        }
        if (iVar12 - iVar8 != 0 && iVar8 <= iVar12) {
          Outputs::CRT::CRT::output_blank(this_00,(iVar12 - iVar8) * 0xe);
        }
      }
LAB_00282afc:
      iVar8 = ((this->super_VideoBase).column_ + iVar13) % 0x41;
      (this->super_VideoBase).column_ = iVar8;
      if (iVar8 == 0) {
        iVar8 = (this->super_VideoBase).row_;
        (this->super_VideoBase).row_ = iVar8 + ((iVar8 + 1) / 0x106) * -0x106 + 1;
        iVar8 = (this->super_VideoBase).super_VideoSwitches<Cycles>.flash_length;
        uVar9 = (long)((this->super_VideoBase).super_VideoSwitches<Cycles>.flash_ + 1) %
                (long)(iVar8 * 2);
        iVar12 = (int)uVar9;
        (this->super_VideoBase).super_VideoSwitches<Cycles>.flash_ = iVar12;
        if ((this->super_VideoBase).super_VideoSwitches<Cycles>.internal_.alternative_character_set
            == false) {
          (this->super_VideoBase).super_VideoSwitches<Cycles>.character_zones_[1].xor_mask =
               -(char)((long)((ulong)(uint)(iVar12 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) /
                      (long)iVar8);
        }
        if (uVar1 < 3) {
          Outputs::CRT::CRT::output_sync(this_00,2);
        }
        else {
          Outputs::CRT::CRT::output_blank(this_00,2);
        }
      }
      local_50.length_ = (IntType)(uint)(iVar11 - iVar13);
    } while (iVar11 - iVar13 != 0);
  }
  return;
}

Assistant:

void advance(Cycles cycles) {
			/*
				Addressing scheme used throughout is that column 0 is the first column with pixels in it;
				row 0 is the first row with pixels in it.

				A frame is oriented around 65 cycles across, 262 lines down.
			*/
			constexpr int first_sync_line = 220;	// A complete guess. Information needed.
			constexpr int first_sync_column = 49;	// Also a guess.
			constexpr int sync_length = 4;			// One of the two likely candidates.

			int int_cycles = int(cycles.as_integral());
			while(int_cycles) {
				const int cycles_this_line = std::min(65 - column_, int_cycles);
				const int ending_column = column_ + cycles_this_line;
				const bool is_vertical_sync_line = (row_ >= first_sync_line && row_ < first_sync_line + 3);

				if(is_vertical_sync_line) {
					// In effect apply an XOR to HSYNC and VSYNC flags in order to include equalising
					// pulses (and hence keep hsync approximately where it should be during vsync).
					const int blank_start = std::max(first_sync_column - sync_length, column_);
					const int blank_end = std::min(first_sync_column, ending_column);
					if(blank_end > blank_start) {
						if(blank_start > column_) {
							crt_.output_sync((blank_start - column_) * 14);
						}
						crt_.output_blank((blank_end - blank_start) * 14);
						if(blank_end < ending_column) {
							crt_.output_sync((ending_column - blank_end) * 14);
						}
					} else {
						crt_.output_sync(cycles_this_line * 14);
					}
				} else {
					const GraphicsMode line_mode = graphics_mode(row_);

					// Determine whether there's any fetching to do. Fetching occurs during the first
					// 40 columns of rows prior to 192.
					if(row_ < 192 && column_ < 40) {
						const int character_row = row_ >> 3;
						const uint16_t row_address = uint16_t((character_row >> 3) * 40 + ((character_row&7) << 7));

						// Grab the memory contents that'll be needed momentarily.
						const int fetch_end = std::min(40, ending_column);
						uint16_t fetch_address;
						switch(line_mode) {
							default:
							case GraphicsMode::Text:
							case GraphicsMode::DoubleText:
							case GraphicsMode::LowRes:
							case GraphicsMode::FatLowRes:
							case GraphicsMode::DoubleLowRes: {
								const uint16_t text_address = uint16_t(((video_page()+1) * 0x400) + row_address);
								fetch_address = uint16_t(text_address + column_);
							} break;

							case GraphicsMode::HighRes:
							case GraphicsMode::DoubleHighRes:
								fetch_address = uint16_t(((video_page()+1) * 0x2000) + row_address + ((row_&7) << 10) + column_);
							break;
						}

						bus_handler_.perform_read(
							fetch_address,
							size_t(fetch_end - column_),
							&base_stream_[size_t(column_)],
							&auxiliary_stream_[size_t(column_)]);
					}

					if(row_ < 192) {
						// The pixel area is the first 40.5 columns; base contents
						// remain where they would naturally be but auxiliary
						// graphics appear to the left of that.
						if(!column_) {
							pixel_pointer_ = crt_.begin_data(568);
							graphics_carry_ = 0;
							was_double_ = true;
						}

						if(column_ < 40) {
							const int pixel_start = std::max(0, column_);
							const int pixel_end = std::min(40, ending_column);
							const int pixel_row = row_ & 7;

							const bool is_double = is_double_mode(line_mode);
							if(!is_double && was_double_ && pixel_pointer_) {
								pixel_pointer_[pixel_start*14 + 0] =
								pixel_pointer_[pixel_start*14 + 1] =
								pixel_pointer_[pixel_start*14 + 2] =
								pixel_pointer_[pixel_start*14 + 3] =
								pixel_pointer_[pixel_start*14 + 4] =
								pixel_pointer_[pixel_start*14 + 5] =
								pixel_pointer_[pixel_start*14 + 6] = 0;
							}
							was_double_ = is_double;

							if(pixel_pointer_) {
								switch(line_mode) {
									case GraphicsMode::Text:
										output_text(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											size_t(pixel_row));
									break;

									case GraphicsMode::DoubleText:
										output_double_text(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											size_t(pixel_row));
									break;

									case GraphicsMode::LowRes:
										output_low_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::FatLowRes:
										output_fat_low_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::DoubleLowRes:
										output_double_low_resolution(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start),
											pixel_start,
											pixel_row);
									break;

									case GraphicsMode::HighRes:
										output_high_resolution(
											&pixel_pointer_[pixel_start * 14 + 7],
											&base_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start));
									break;

									case GraphicsMode::DoubleHighRes:
										output_double_high_resolution(
											&pixel_pointer_[pixel_start * 14],
											&base_stream_[size_t(pixel_start)],
											&auxiliary_stream_[size_t(pixel_start)],
											size_t(pixel_end - pixel_start));
									break;

									default: break;
								}
							}

							if(pixel_end == 40) {
								if(pixel_pointer_) {
									if(was_double_) {
										pixel_pointer_[560] = pixel_pointer_[561] = pixel_pointer_[562] = pixel_pointer_[563] =
										pixel_pointer_[564] = pixel_pointer_[565] = pixel_pointer_[566] = pixel_pointer_[567] = 0;
									} else {
										if(line_mode == GraphicsMode::HighRes && base_stream_[39]&0x80)
											pixel_pointer_[567] = graphics_carry_;
										else
											pixel_pointer_[567] = 0;
									}
								}

								crt_.output_data(568, 568);
								pixel_pointer_ = nullptr;
							}
						}
					} else {
						if(column_ < 40 && ending_column >= 40) {
							crt_.output_blank(568);
						}
					}

					/*
						The left border, sync, right border pattern doesn't depend on whether
						there were pixels this row and is output as soon as it is known.
					*/

					if(column_ < first_sync_column && ending_column >= first_sync_column) {
						crt_.output_blank(first_sync_column*14 - 568);
					}

					if(column_ < (first_sync_column + sync_length) && ending_column >= (first_sync_column + sync_length)) {
						crt_.output_sync(sync_length*14);
					}

					int second_blank_start;
					// Colour burst is present on all lines of the display if graphics mode is enabled on the top
					// portion; therefore use the graphics mode on line 0 rather than the current line, to avoid
					// disabling it in mixed modes.
					if(!is_text_mode(graphics_mode(0))) {
						const int colour_burst_start = std::max(first_sync_column + sync_length + 1, column_);
						const int colour_burst_end = std::min(first_sync_column + sync_length + 4, ending_column);
						if(colour_burst_end > colour_burst_start) {
							// UGLY HACK AHOY!
							// The OpenGL scan target introduces a phase error of 1/8th of a wave. The Metal one does not.
							// Supply the real phase value if this is an Apple build.
							// TODO: eliminate UGLY HACK.
#if defined(__APPLE__) && !defined(IGNORE_APPLE)
							constexpr uint8_t phase = 224;
#else
							constexpr uint8_t phase = 192;
#endif

							crt_.output_colour_burst((colour_burst_end - colour_burst_start) * 14, phase);
						}

						second_blank_start = std::max(first_sync_column + sync_length + 3, column_);
					} else {
						second_blank_start = std::max(first_sync_column + sync_length, column_);
					}

					if(ending_column > second_blank_start) {
						crt_.output_blank((ending_column - second_blank_start) * 14);
					}
				}

				int_cycles -= cycles_this_line;
				column_ = (column_ + cycles_this_line) % 65;
				if(!column_) {
					row_ = (row_ + 1) % 262;
					did_end_line();

					// Add an extra half a colour cycle of blank; this isn't counted in the run_for
					// count explicitly but is promised. If this is a vertical sync line, output sync
					// instead of blank, taking that to be the default level.
					if(is_vertical_sync_line) {
						crt_.output_sync(2);
					} else {
						crt_.output_blank(2);
					}
				}
			}
		}